

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__declare
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  undefined8 uVar1;
  bool bVar2;
  byte *pbVar3;
  StringHash SVar4;
  uint64 uVar5;
  long lVar6;
  xmlChar **ppxVar7;
  xmlChar *text;
  bool failed_1;
  ParserChar *attributeValue;
  bool failed;
  bool local_129;
  ParserChar *local_128;
  URI *local_120;
  URI local_118;
  
  pbVar3 = (byte *)GeneratedSaxParser::StackMemoryManager::newObject
                             (&(this->
                               super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                               ).super_ParserTemplateBase.mStackMemoryManager,0x118);
  uVar1 = declare__AttributeData::DEFAULT._8_8_;
  *(undefined8 *)pbVar3 = declare__AttributeData::DEFAULT._0_8_;
  *(undefined8 *)(pbVar3 + 8) = uVar1;
  uVar1 = declare__AttributeData::DEFAULT._24_8_;
  *(undefined8 *)(pbVar3 + 0x10) = declare__AttributeData::DEFAULT._16_8_;
  *(undefined8 *)(pbVar3 + 0x18) = uVar1;
  uVar1 = declare__AttributeData::DEFAULT._40_8_;
  *(undefined8 *)(pbVar3 + 0x20) = declare__AttributeData::DEFAULT._32_8_;
  *(undefined8 *)(pbVar3 + 0x28) = uVar1;
  local_120 = (URI *)(pbVar3 + 0x30);
  COLLADABU::URI::URI(local_120,(URI *)(declare__AttributeData::DEFAULT + 0x30),false);
  *attributeDataPtr = pbVar3;
  ppxVar7 = attributes->attributes;
  if ((ppxVar7 != (xmlChar **)0x0) && (text = *ppxVar7, text != (xmlChar *)0x0)) {
    do {
      SVar4 = GeneratedSaxParser::Utils::calculateStringHash(text);
      local_128 = ppxVar7[1];
      if ((long)SVar4 < 0x79a665) {
        if (SVar4 == 0x7c065) {
          *(ParserChar **)(pbVar3 + 8) = local_128;
        }
        else if (SVar4 == 0x593f0c) {
          GeneratedSaxParser::Utils::toURI(&local_118,&local_128,&local_129);
          COLLADABU::URI::operator=(local_120,&local_118);
          COLLADABU::URI::~URI(&local_118);
          if ((local_129 == true) &&
             (bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                                ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                                 ERROR_ATTRIBUTE_PARSING_FAILED,0xaba28e5,0x593f0c,local_128), bVar2
             )) {
            return false;
          }
          if ((local_129 & 1U) == 0) {
            *pbVar3 = *pbVar3 | 2;
          }
        }
        else {
          if (SVar4 != 0x7488e3) {
LAB_0074d871:
            bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                              ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                               ERROR_UNKNOWN_ATTRIBUTE,0xaba28e5,text,local_128);
            goto LAB_0074d888;
          }
          uVar5 = GeneratedSaxParser::Utils::toUint64(local_128,(bool *)&local_118);
          *(uint64 *)(pbVar3 + 0x18) = uVar5;
          if (((byte)local_118.mUriString._M_dataplus._M_p == 1) &&
             (bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                                ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                                 ERROR_ATTRIBUTE_PARSING_FAILED,0xaba28e5,0x7488e3,local_128), bVar2
             )) {
            return false;
          }
          if (((byte)local_118.mUriString._M_dataplus._M_p & 1) == 0) {
            *pbVar3 = *pbVar3 | 1;
          }
        }
      }
      else if (SVar4 == 0x79a665) {
        *(ParserChar **)(pbVar3 + 0x10) = local_128;
      }
      else if (SVar4 == 0x4a5aa87) {
        *(ParserChar **)(pbVar3 + 0x28) = local_128;
      }
      else {
        if (SVar4 != 0xc9ffd35) goto LAB_0074d871;
        SVar4 = GeneratedSaxParser::Utils::calculateStringHash(local_128,(bool *)&local_118);
        lVar6 = 8;
        do {
          if (*(StringHash *)(&UNK_008374e8 + lVar6) == SVar4) {
            *(undefined4 *)(pbVar3 + 0x20) =
                 *(undefined4 *)((long)&ENUM__mathml__declare__occurrenceMap + lVar6);
            goto LAB_0074d8ff;
          }
          lVar6 = lVar6 + 0x10;
        } while (lVar6 != 0x38);
        local_118.mUriString._M_dataplus._M_p._0_1_ = 1;
        pbVar3[0x20] = 3;
        pbVar3[0x21] = 0;
        pbVar3[0x22] = 0;
        pbVar3[0x23] = 0;
        bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                          ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                           ERROR_ATTRIBUTE_PARSING_FAILED,0xaba28e5,0xc9ffd35,local_128);
LAB_0074d888:
        if (bVar2 != false) {
          return false;
        }
      }
LAB_0074d8ff:
      ppxVar7 = ppxVar7 + 2;
      text = *ppxVar7;
    } while (text != (xmlChar *)0x0);
  }
  if ((*pbVar3 & 2) == 0) {
    COLLADABU::URI::URI(&local_118,"");
    COLLADABU::URI::operator=(local_120,&local_118);
    COLLADABU::URI::~URI(&local_118);
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__declare( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__declare( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

declare__AttributeData* attributeData = newData<declare__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_TYPE:
    {

attributeData->type = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_SCOPE:
    {

attributeData->scope = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_NARGS:
    {
bool failed;
attributeData->nargs = GeneratedSaxParser::Utils::toUint64(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_DECLARE,
        HASH_ATTRIBUTE_NARGS,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= declare__AttributeData::ATTRIBUTE_NARGS_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_OCCURRENCE:
    {
bool failed;
attributeData->occurrence = Utils::toEnum<ENUM__mathml__declare__occurrence, StringHash, ENUM__mathml__declare__occurrence__COUNT>(attributeValue, failed, ENUM__mathml__declare__occurrenceMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_DECLARE,
        HASH_ATTRIBUTE_OCCURRENCE,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_ENCODING:
    {

attributeData->encoding = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_DEFINITIONURL:
    {
bool failed;
attributeData->definitionURL = GeneratedSaxParser::Utils::toURI(&attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_DECLARE,
        HASH_ATTRIBUTE_DEFINITIONURL,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= declare__AttributeData::ATTRIBUTE_DEFINITIONURL_PRESENT;

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_DECLARE, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ((attributeData->present_attributes & declare__AttributeData::ATTRIBUTE_DEFINITIONURL_PRESENT) == 0)
{
    attributeData->definitionURL = COLLADABU::URI("");
}


    return true;
}